

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void pre_out(c2m_ctx_t c2m_ctx,token_t t)

{
  pre_ctx *ppVar1;
  pos_t pos;
  char cVar2;
  size_t sVar3;
  token_t ptVar4;
  pre_ctx_t t_00;
  char *str;
  bool bVar5;
  str_t sVar6;
  char *local_60;
  char *local_50;
  char *s;
  int err_p;
  int t_quot_off;
  int last_t_quot_off;
  int type;
  token_t last_t;
  undefined8 local_28;
  pre_ctx_t pre_ctx;
  token_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  if (t == (token_t)0x0) {
    if (ppVar1->pre_last_token == (token_t)0x0) {
      last_t = (token_t)(char *)0x0;
      local_28._0_4_ = -1;
      local_28._4_4_ = -1;
    }
    else {
      ptVar4 = ppVar1->pre_last_token;
      last_t = (token_t)(ptVar4->pos).fname;
      local_28._0_4_ = (ptVar4->pos).lno;
      local_28._4_4_ = (ptVar4->pos).ln_pos;
    }
    pos.lno = (int)local_28;
    pos.ln_pos = local_28._4_4_;
    pos.fname = (char *)last_t;
    pre_ctx = (pre_ctx_t)new_token(c2m_ctx,pos,"<EOF>",0x13d,N_IGNORE);
  }
  else {
    if (((short)*(undefined4 *)t == 0x147) || ((short)*(undefined4 *)t == -1)) {
      __assert_fail("t->code != T_EOU && t->code != EOF",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xeda,"void pre_out(c2m_ctx_t, token_t)");
    }
    ppVar1->pre_last_token = t;
    pre_ctx = (pre_ctx_t)pptoken2token(c2m_ctx,t,1);
    if (pre_ctx == (pre_ctx_t)0x0) {
      return;
    }
  }
  if ((((short)*(undefined4 *)&pre_ctx->once_include_files == 0x102) &&
      (sVar3 = VARR_token_tlength(c2m_ctx->recorded_tokens), sVar3 != 0)) &&
     (ptVar4 = VARR_token_tlast(c2m_ctx->recorded_tokens), (short)*(undefined4 *)ptVar4 == 0x102)) {
    t_00 = (pre_ctx_t)VARR_token_tpop(c2m_ctx->recorded_tokens);
    t_quot_off = 0x20;
    err_p = 0;
    s._4_4_ = 0;
    bVar5 = false;
    VARR_chartrunc(c2m_ctx->temp_string,0);
    if ((**(char **)&t_00->no_out_p == 'u') && ((*(char **)&t_00->no_out_p)[1] == '8')) {
      bVar5 = false;
      if ((**(char **)&pre_ctx->no_out_p != '\"') &&
         (bVar5 = true, **(char **)&pre_ctx->no_out_p == 'u')) {
        bVar5 = *(char *)(*(long *)&pre_ctx->no_out_p + 1) != '8';
      }
      err_p = 2;
    }
    else if ((**(char **)&t_00->no_out_p == 'L') ||
            ((**(char **)&t_00->no_out_p == 'u' || (**(char **)&t_00->no_out_p == 'U')))) {
      bVar5 = false;
      if ((**(char **)&pre_ctx->no_out_p != '\"') &&
         (bVar5 = true, **(char **)&pre_ctx->no_out_p == **(char **)&t_00->no_out_p)) {
        bVar5 = *(char *)(*(long *)&pre_ctx->no_out_p + 1) == '8';
      }
      err_p = 1;
    }
    if ((**(char **)&pre_ctx->no_out_p == 'u') &&
       (*(char *)(*(long *)&pre_ctx->no_out_p + 1) == '8')) {
      bVar5 = false;
      if ((**(char **)&t_00->no_out_p != '\"') && (bVar5 = true, **(char **)&t_00->no_out_p == 'u'))
      {
        bVar5 = (*(char **)&t_00->no_out_p)[1] != '8';
      }
      s._4_4_ = 2;
    }
    else if ((**(char **)&pre_ctx->no_out_p == 'L') ||
            ((**(char **)&pre_ctx->no_out_p == 'u' || (**(char **)&pre_ctx->no_out_p == 'U')))) {
      bVar5 = false;
      if ((**(char **)&t_00->no_out_p != '\"') &&
         (bVar5 = true, **(char **)&pre_ctx->no_out_p == **(char **)&t_00->no_out_p)) {
        bVar5 = (*(char **)&t_00->no_out_p)[1] == '8';
      }
      s._4_4_ = 1;
    }
    if (bVar5) {
      error(c2m_ctx,0x1d7549,(char *)pre_ctx->temp_tokens,pre_ctx->macro_tab);
    }
    if ((**(char **)&t_00->no_out_p == 'L') || (**(char **)&pre_ctx->no_out_p == 'L')) {
      t_quot_off = 0x4c;
    }
    else if ((**(char **)&t_00->no_out_p == 'U') || (**(char **)&pre_ctx->no_out_p == 'U')) {
      t_quot_off = 0x55;
    }
    else if ((**(char **)&t_00->no_out_p == 'L') || (**(char **)&pre_ctx->no_out_p == 'L')) {
      t_quot_off = 0x4c;
    }
    else if (((**(char **)&t_00->no_out_p == 'u') && ((*(char **)&t_00->no_out_p)[1] == '8')) ||
            ((**(char **)&pre_ctx->no_out_p == 'u' &&
             (*(char *)(*(long *)&pre_ctx->no_out_p + 1) == '8')))) {
      VARR_charpush(c2m_ctx->temp_string,'u');
      t_quot_off = 0x38;
    }
    else if ((**(char **)&t_00->no_out_p == 'u') || (**(char **)&pre_ctx->no_out_p == 'u')) {
      t_quot_off = 0x75;
    }
    if (t_quot_off != 0x20) {
      VARR_charpush(c2m_ctx->temp_string,(char)t_quot_off);
    }
    for (local_50 = *(char **)&t_00->no_out_p + err_p; *local_50 != '\0'; local_50 = local_50 + 1) {
      VARR_charpush(c2m_ctx->temp_string,*local_50);
    }
    cVar2 = VARR_charlast(c2m_ctx->temp_string);
    if (cVar2 != '\"') {
      __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xf03,"void pre_out(c2m_ctx_t, token_t)");
    }
    VARR_charpop(c2m_ctx->temp_string);
    local_50 = (char *)(*(long *)&pre_ctx->no_out_p + (long)s._4_4_);
    while (local_50 = local_50 + 1, *local_50 != '\0') {
      VARR_charpush(c2m_ctx->temp_string,*local_50);
    }
    cVar2 = VARR_charlast(c2m_ctx->temp_string);
    if (cVar2 != '\"') {
      __assert_fail("VARR_LAST (char, temp_string) == \'\"\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0xf07,"void pre_out(c2m_ctx_t, token_t)");
    }
    VARR_charpush(c2m_ctx->temp_string,'\0');
    str = VARR_charaddr(c2m_ctx->temp_string);
    sVar6 = uniq_cstr(c2m_ctx,str);
    local_60 = sVar6.s;
    *(char **)&t_00->no_out_p = local_60;
    set_string_val(c2m_ctx,(token_t)t_00,c2m_ctx->temp_string,t_quot_off);
    pre_ctx = t_00;
  }
  VARR_token_tpush(c2m_ctx->recorded_tokens,(token_t)pre_ctx);
  return;
}

Assistant:

static void pre_out (c2m_ctx_t c2m_ctx, token_t t) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;

  if (t == NULL) {
    t = new_token (c2m_ctx, pre_last_token == NULL ? no_pos : pre_last_token->pos, "<EOF>",
                   T_EOFILE, N_IGNORE);
  } else {
    assert (t->code != T_EOU && t->code != EOF);
    pre_last_token = t;
    if ((t = pptoken2token (c2m_ctx, t, TRUE)) == NULL) return;
  }
  if (t->code == T_STR && VARR_LENGTH (token_t, recorded_tokens) != 0
      && VARR_LAST (token_t, recorded_tokens)->code == T_STR) { /* concat strings */
    token_t last_t = VARR_POP (token_t, recorded_tokens);
    int type = ' ', last_t_quot_off = 0, t_quot_off = 0, err_p = FALSE;
    const char *s;

    VARR_TRUNC (char, temp_string, 0);
    if (last_t->repr[0] == 'u' && last_t->repr[1] == '8') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != 'u' || t->repr[1] != '8');
      last_t_quot_off = 2;
    } else if (last_t->repr[0] == 'L' || last_t->repr[0] == 'u' || last_t->repr[0] == 'U') {
      err_p = t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || t->repr[1] == '8');
      last_t_quot_off = 1;
    }
    if (t->repr[0] == 'u' && t->repr[1] == '8') {
      err_p = last_t->repr[0] != '\"' && (last_t->repr[0] != 'u' || last_t->repr[1] != '8');
      t_quot_off = 2;
    } else if (t->repr[0] == 'L' || t->repr[0] == 'u' || t->repr[0] == 'U') {
      err_p = last_t->repr[0] != '\"' && (t->repr[0] != last_t->repr[0] || last_t->repr[1] == '8');
      t_quot_off = 1;
    }
    if (err_p) error (c2m_ctx, t->pos, "concatenation of different type string literals");
    if (sizeof (mir_wchar) == 4 && (last_t->repr[0] == 'L' || t->repr[0] == 'L')) {
      type = 'L';
    } else if (last_t->repr[0] == 'U' || t->repr[0] == 'U') {
      type = 'U';
    } else if (last_t->repr[0] == 'L' || t->repr[0] == 'L') {
      type = 'L';
    } else if ((last_t->repr[0] == 'u' && last_t->repr[1] == '8')
               || (t->repr[0] == 'u' && t->repr[1] == '8')) {
      VARR_PUSH (char, temp_string, 'u');
      type = '8';
    } else if ((last_t->repr[0] == 'u' || t->repr[0] == 'u')) {
      type = 'u';
    }
    if (type != ' ') VARR_PUSH (char, temp_string, type);
    for (s = last_t->repr + last_t_quot_off; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_POP (char, temp_string);
    for (s = t->repr + t_quot_off + 1; *s != 0; s++) VARR_PUSH (char, temp_string, *s);
    t = last_t;
    assert (VARR_LAST (char, temp_string) == '"');
    VARR_PUSH (char, temp_string, '\0');
    t->repr = uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
    set_string_val (c2m_ctx, t, temp_string, type);
  }
  VARR_PUSH (token_t, recorded_tokens, t);
}